

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void av1_global_motion_estimation_mt(AV1_COMP *cpi)

{
  uint uVar1;
  ThreadData_conflict *pTVar2;
  EncWorkerData *pEVar3;
  AVxWorker *pAVar4;
  EncWorkerData *pEVar5;
  ThreadData_conflict *pTVar6;
  undefined1 *puVar7;
  MultiThreadInfo *pMVar8;
  AV1GlobalMotionSync *pAVar9;
  uint8_t *puVar10;
  int *piVar11;
  uint uVar12;
  ulong uVar13;
  char cVar14;
  uint num_workers;
  long lVar15;
  ulong uVar16;
  
  pAVar9 = &(cpi->mt_info).gm_sync;
  (pAVar9->job_info).thread_id_to_dir[0x30] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x31] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x32] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x33] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x34] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x35] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x36] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x37] = '\0';
  pAVar9 = &(cpi->mt_info).gm_sync;
  (pAVar9->job_info).thread_id_to_dir[0x38] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x39] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x3a] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x3b] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x3c] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x3d] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x3e] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x3f] = '\0';
  pAVar9 = &(cpi->mt_info).gm_sync;
  (pAVar9->job_info).thread_id_to_dir[0x20] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x21] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x22] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x23] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x24] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x25] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x26] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x27] = '\0';
  pAVar9 = &(cpi->mt_info).gm_sync;
  (pAVar9->job_info).thread_id_to_dir[0x28] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x29] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x2a] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x2b] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x2c] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x2d] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x2e] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x2f] = '\0';
  pAVar9 = &(cpi->mt_info).gm_sync;
  (pAVar9->job_info).thread_id_to_dir[0x10] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x11] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x12] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x13] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x14] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x15] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x16] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x17] = '\0';
  pAVar9 = &(cpi->mt_info).gm_sync;
  (pAVar9->job_info).thread_id_to_dir[0x18] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x19] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x1a] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x1b] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x1c] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x1d] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x1e] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0x1f] = '\0';
  (cpi->mt_info).gm_sync.job_info.early_exit[0] = '\0';
  (cpi->mt_info).gm_sync.job_info.early_exit[1] = '\0';
  (cpi->mt_info).gm_sync.job_info.next_frame_to_process[0] = '\0';
  (cpi->mt_info).gm_sync.job_info.next_frame_to_process[1] = '\0';
  pMVar8 = &cpi->mt_info;
  (pMVar8->gm_sync).job_info.thread_id_to_dir[0] = '\0';
  (pMVar8->gm_sync).job_info.thread_id_to_dir[1] = '\0';
  (pMVar8->gm_sync).job_info.thread_id_to_dir[2] = '\0';
  (pMVar8->gm_sync).job_info.thread_id_to_dir[3] = '\0';
  (pMVar8->gm_sync).job_info.thread_id_to_dir[4] = '\0';
  (pMVar8->gm_sync).job_info.thread_id_to_dir[5] = '\0';
  (pMVar8->gm_sync).job_info.thread_id_to_dir[6] = '\0';
  (pMVar8->gm_sync).job_info.thread_id_to_dir[7] = '\0';
  pAVar9 = &(cpi->mt_info).gm_sync;
  (pAVar9->job_info).thread_id_to_dir[8] = '\0';
  (pAVar9->job_info).thread_id_to_dir[9] = '\0';
  (pAVar9->job_info).thread_id_to_dir[10] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0xb] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0xc] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0xd] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0xe] = '\0';
  (pAVar9->job_info).thread_id_to_dir[0xf] = '\0';
  uVar12 = (cpi->gm_info).num_ref_frames[1] + (cpi->gm_info).num_ref_frames[0];
  num_workers = 2;
  if ((int)uVar12 < 2) {
    num_workers = uVar12;
  }
  if ((cpi->sf).gm_sf.prune_ref_frame_for_gm_search == 0) {
    num_workers = uVar12;
  }
  uVar12 = (cpi->mt_info).num_workers;
  if ((int)uVar12 <= (int)num_workers) {
    num_workers = uVar12;
  }
  uVar16 = 0;
  if (0 < (int)num_workers) {
    uVar16 = (ulong)num_workers;
  }
  cVar14 = '\0';
  for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
    (cpi->mt_info).gm_sync.job_info.thread_id_to_dir[uVar13] = cVar14;
    cVar14 = cVar14 + '\x01';
    if (cVar14 == '\x02') {
      cVar14 = '\0';
    }
  }
  (cpi->mt_info).gm_sync.gm_mt_exit = false;
  pTVar2 = &cpi->td;
  uVar12 = num_workers;
  while (0 < (int)uVar12) {
    uVar1 = uVar12 - 1;
    pAVar4 = (cpi->mt_info).workers;
    pEVar5 = (cpi->mt_info).tile_thr_data;
    pEVar3 = pEVar5 + uVar1;
    pAVar4[uVar1].hook = gm_mt_worker_hook;
    pAVar4[uVar1].data1 = pEVar3;
    pAVar4[uVar1].data2 = (void *)0x0;
    pEVar5[uVar1].thread_id = uVar12 - 1;
    pEVar5[uVar1].start = uVar12 - 1;
    pEVar5[uVar1].cpi = cpi;
    if (uVar12 == 1) {
      pEVar3->td = pTVar2;
      uVar12 = uVar1;
    }
    else {
      pTVar6 = pEVar3->original_td;
      pEVar3->td = pTVar6;
      uVar12 = uVar1;
      if (pTVar6 != pTVar2) {
        puVar10 = (uint8_t *)
                  aom_malloc((long)(cpi->gm_info).segment_map_h * (long)(cpi->gm_info).segment_map_w
                            );
        (pTVar6->gm_data).segment_map = puVar10;
        if (puVar10 == (uint8_t *)0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate gm_data->segment_map");
        }
        (pTVar6->gm_data).motion_models[0].inliers = (int *)0x0;
        *(undefined8 *)&(pTVar6->gm_data).motion_models[0].num_inliers = 0;
        (pTVar6->gm_data).motion_models[0].params[4] = 0.0;
        (pTVar6->gm_data).motion_models[0].params[5] = 0.0;
        (pTVar6->gm_data).motion_models[0].params[2] = 0.0;
        (pTVar6->gm_data).motion_models[0].params[3] = 0.0;
        (pTVar6->gm_data).motion_models[0].params[0] = 0.0;
        (pTVar6->gm_data).motion_models[0].params[1] = 0.0;
        piVar11 = (int *)aom_malloc(0x8000);
        (pTVar6->gm_data).motion_models[0].inliers = piVar11;
        if (piVar11 == (int *)0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate gm_data->motion_models[m].inliers");
        }
      }
    }
  }
  launch_workers(&cpi->mt_info,num_workers);
  sync_enc_workers(&cpi->mt_info,&cpi->common,num_workers);
  for (lVar15 = 0; uVar16 * 0x1d0 - lVar15 != 0; lVar15 = lVar15 + 0x1d0) {
    puVar7 = *(undefined1 **)((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar15 + -0x18);
    if ((ThreadData_conflict *)puVar7 != pTVar2) {
      aom_free(*(void **)(puVar7 + 0x26e38));
      *(undefined8 *)(puVar7 + 0x26e38) = 0;
      aom_free(*(void **)(puVar7 + 0x26e28));
      *(undefined8 *)(puVar7 + 0x26e28) = 0;
    }
  }
  return;
}

Assistant:

void av1_global_motion_estimation_mt(AV1_COMP *cpi) {
  GlobalMotionJobInfo *job_info = &cpi->mt_info.gm_sync.job_info;

  av1_zero(*job_info);

  int num_workers = compute_gm_workers(cpi);

  assign_thread_to_dir(job_info->thread_id_to_dir, num_workers);
  prepare_gm_workers(cpi, gm_mt_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, &cpi->common, num_workers);
  gm_dealloc_thread_data(cpi, num_workers);
}